

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ArrayFeatureExtractor::~ArrayFeatureExtractor(ArrayFeatureExtractor *this)

{
  ~ArrayFeatureExtractor(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ArrayFeatureExtractor::~ArrayFeatureExtractor() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ArrayFeatureExtractor)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}